

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

bool tcu::anyNotEqual<int,3>(Vector<int,_3> *a,Vector<int,_3> *b)

{
  bool bVar1;
  bool bVar2;
  int local_20;
  int i;
  bool res;
  Vector<int,_3> *b_local;
  Vector<int,_3> *a_local;
  
  bVar2 = false;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    bVar1 = !bVar2;
    bVar2 = true;
    if (bVar1) {
      bVar2 = a->m_data[local_20] != b->m_data[local_20];
    }
  }
  return bVar2;
}

Assistant:

inline bool anyNotEqual (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	bool res = false;
	for (int i = 0; i < Size; i++)
		res = res || a.m_data[i] != b.m_data[i];
	return res;
}